

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall
flatbuffers::Parser::Parse(Parser *this,char *source,char **include_paths,char *source_filename)

{
  bool bVar1;
  undefined1 local_2f [10];
  bool r;
  int initial_depth;
  char *source_filename_local;
  char **include_paths_local;
  char *source_local;
  Parser *this_local;
  
  local_2f._3_4_ = this->parse_depth_counter_;
  unique0x10000102 = source_filename;
  source_filename_local = (char *)include_paths;
  include_paths_local = (char **)source;
  source_local = (char *)this;
  if (((this->opts).use_flexbuffers & 1U) == 0) {
    ParseRoot((Parser *)local_2f,(char *)this,(char **)source,(char *)include_paths);
    bVar1 = CheckedError::Check((CheckedError *)local_2f);
    local_2f[2] = (bVar1 ^ 0xffU) & 1;
    CheckedError::~CheckedError((CheckedError *)local_2f);
  }
  else {
    local_2f[2] = ParseFlexBuffer(this,source,source_filename,&this->flex_builder_);
  }
  if (local_2f._3_4_ == this->parse_depth_counter_) {
    return (bool)(local_2f[2] & 1);
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0xd92,"bool flatbuffers::Parser::Parse(const char *, const char **, const char *)")
  ;
}

Assistant:

bool Parser::Parse(const char *source, const char **include_paths,
                   const char *source_filename) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  bool r;

  if (opts.use_flexbuffers) {
    r = ParseFlexBuffer(source, source_filename, &flex_builder_);
  } else {
    r = !ParseRoot(source, include_paths, source_filename).Check();
  }
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return r;
}